

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::CodedStreamTest_NegativeLimitAfterReading_Test::
~CodedStreamTest_NegativeLimitAfterReading_Test
          (CodedStreamTest_NegativeLimitAfterReading_Test *this)

{
  CodedStreamTest_NegativeLimitAfterReading_Test *this_local;
  
  ~CodedStreamTest_NegativeLimitAfterReading_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CodedStreamTest, NegativeLimitAfterReading) {
  // Check what happens when we push a negative limit.
  ArrayInputStream input(buffer_, sizeof(buffer_));
  CodedInputStream coded_input(&input);
  ASSERT_TRUE(coded_input.Skip(128));

  CodedInputStream::Limit limit = coded_input.PushLimit(-64);
  // BytesUntilLimit() returns -1 to mean "no limit", which actually means
  // "the limit is INT_MAX relative to the beginning of the stream".
  EXPECT_EQ(-1, coded_input.BytesUntilLimit());
  coded_input.PopLimit(limit);
}